

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

int __thiscall google::protobuf::Fls128(protobuf *this,uint128 n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  LogMessage *other;
  uint uVar4;
  protobuf *ppVar5;
  protobuf *ppVar6;
  ulong uVar7;
  uint64 hi;
  LogFinisher LStack_49;
  LogMessage LStack_48;
  
  if (n.lo_ == 0) {
    if (this == (protobuf *)0x0) {
      internal::LogMessage::LogMessage
                (&LStack_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
                 ,0x3b);
      other = internal::LogMessage::operator<<(&LStack_48,"CHECK failed: (0) != (n): ");
      internal::LogFinisher::operator=(&LStack_49,other);
      internal::LogMessage::~LogMessage(&LStack_48);
    }
    ppVar5 = (protobuf *)((ulong)this >> 0x20);
    ppVar6 = ppVar5;
    if (ppVar5 == (protobuf *)0x0) {
      ppVar6 = this;
    }
    iVar2 = (uint)(ppVar5 != (protobuf *)0x0) * 0x20;
    uVar7 = (ulong)ppVar6 >> 0x10 & 0xffff;
    iVar1 = iVar2 + 0x10;
    if (ppVar6 < (protobuf *)0x10000) {
      uVar7 = (ulong)ppVar6 & 0xffffffff;
      iVar1 = iVar2;
    }
    uVar3 = (uint)(uVar7 >> 8);
    iVar2 = iVar1 + 8;
    if ((uint)uVar7 < 0x100) {
      uVar3 = (uint)uVar7;
      iVar2 = iVar1;
    }
    uVar4 = uVar3 >> 4;
    iVar1 = iVar2 + 4;
    if (uVar3 < 0x10) {
      uVar4 = uVar3;
      iVar1 = iVar2;
    }
    return ((uint)(0x3333333322221100 >> ((byte)(uVar4 << 2) & 0x3f)) & 3) + iVar1;
  }
  iVar1 = Fls64(n.lo_);
  return iVar1 + 0x40;
}

Assistant:

static inline int Fls128(uint128 n) {
  if (uint64 hi = Uint128High64(n)) {
    return Fls64(hi) + 64;
  }
  return Fls64(Uint128Low64(n));
}